

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O1

VRVector3 * __thiscall
MinVR::VRVector3::normalize(VRVector3 *__return_storage_ptr__,VRVector3 *this)

{
  float xx;
  float yy;
  float zz;
  float fVar1;
  
  xx = this->x;
  yy = this->y;
  zz = this->z;
  fVar1 = zz * zz + xx * xx + yy * yy;
  if (1e-08 <= fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = 1.0 / fVar1;
    xx = this->x * fVar1;
    yy = this->y * fVar1;
    zz = fVar1 * this->z;
  }
  VRVector3(__return_storage_ptr__,xx,yy,zz);
  return __return_storage_ptr__;
}

Assistant:

VRVector3 VRVector3::normalize() {
  // Hill & Kelley provide this:
  float sizeSq = x*x + y*y + z*z; 
  if (sizeSq < VRMATH_EPSILON) { 
    return VRVector3(x,y,z); // does nothing to zero vectors;
  } 
  float scaleFactor = (float)1.0/(float)sqrt(sizeSq);
  float xx = x * scaleFactor; 
  float yy = y * scaleFactor;
  float zz = z * scaleFactor;
  return VRVector3(xx, yy, zz);
}